

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::wheelEvent(QGraphicsView *this,QWheelEvent *event)

{
  QPoint pixelDelta;
  bool bVar1;
  Representation RVar2;
  int iVar3;
  Representation RVar4;
  QGraphicsViewPrivate *pQVar5;
  QObject *pQVar6;
  QEvent *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  bool horizontal;
  QGraphicsViewPrivate *d;
  QGraphicsSceneWheelEvent wheelEvent;
  undefined4 in_stack_ffffffffffffff28;
  Orientation in_stack_ffffffffffffff2c;
  QGraphicsSceneEvent *in_stack_ffffffffffffff30;
  QEvent *pQVar7;
  undefined4 in_stack_ffffffffffffff38;
  QFlagsStorage<Qt::MouseButton> in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int local_70;
  QPoint local_6c;
  int local_64;
  QPointF local_60;
  QPoint local_50;
  QPointF local_48;
  QPoint local_38;
  QPointF local_30;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QGraphicsView *)0xa3ea65);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3ea7b);
  if ((bVar1) && ((*(uint *)&pQVar5->field_0x300 & 1) != 0)) {
    QEvent::ignore(in_RSI);
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneWheelEvent::QGraphicsSceneWheelEvent
              ((QGraphicsSceneWheelEvent *)in_RDI,in_stack_ffffffffffffff3c.i);
    QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff30);
    QGraphicsSceneEvent::setWidget
              (in_stack_ffffffffffffff30,
               (QWidget *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    local_48 = QSinglePointEvent::position((QSinglePointEvent *)0xa3eb15);
    local_38 = QPointF::toPoint(in_RDI);
    local_30 = mapToScene((QGraphicsView *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          (QPoint *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    QGraphicsSceneWheelEvent::setScenePos
              ((QGraphicsSceneWheelEvent *)in_stack_ffffffffffffff30,
               (QPointF *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    local_60 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0xa3eb7f);
    local_50 = QPointF::toPoint(in_RDI);
    QGraphicsSceneWheelEvent::setScreenPos
              ((QGraphicsSceneWheelEvent *)in_stack_ffffffffffffff30,
               (QPoint *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    QSinglePointEvent::buttons((QSinglePointEvent *)in_stack_ffffffffffffff30);
    QGraphicsSceneWheelEvent::setButtons
              ((QGraphicsSceneWheelEvent *)in_stack_ffffffffffffff30,
               (MouseButtons)in_stack_ffffffffffffff3c.i);
    QInputEvent::modifiers((QInputEvent *)in_stack_ffffffffffffff30);
    QGraphicsSceneWheelEvent::setModifiers
              ((QGraphicsSceneWheelEvent *)in_stack_ffffffffffffff30,
               (KeyboardModifiers)in_stack_ffffffffffffff3c.i);
    local_6c = QWheelEvent::angleDelta((QWheelEvent *)in_stack_ffffffffffffff30);
    local_64 = QPoint::x((QPoint *)0xa3ec0c);
    RVar2.m_i = qAbs<int>(&local_64);
    QWheelEvent::angleDelta((QWheelEvent *)in_stack_ffffffffffffff30);
    local_70 = QPoint::y((QPoint *)0xa3ec37);
    iVar3 = qAbs<int>(&local_70);
    if (iVar3 < RVar2.m_i) {
      QWheelEvent::angleDelta((QWheelEvent *)in_stack_ffffffffffffff30);
      RVar4.m_i = QPoint::x((QPoint *)0xa3ec76);
    }
    else {
      QWheelEvent::angleDelta((QWheelEvent *)in_stack_ffffffffffffff30);
      RVar4.m_i = QPoint::y((QPoint *)0xa3ec95);
    }
    QGraphicsSceneWheelEvent::setDelta
              ((QGraphicsSceneWheelEvent *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    QWheelEvent::pixelDelta((QWheelEvent *)in_stack_ffffffffffffff30);
    pixelDelta.yp.m_i = RVar2.m_i;
    pixelDelta.xp.m_i = RVar4.m_i;
    QGraphicsSceneWheelEvent::setPixelDelta
              ((QGraphicsSceneWheelEvent *)in_stack_ffffffffffffff30,pixelDelta);
    QWheelEvent::phase((QWheelEvent *)in_RSI);
    QGraphicsSceneWheelEvent::setPhase
              ((QGraphicsSceneWheelEvent *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    QWheelEvent::isInverted((QWheelEvent *)in_RSI);
    QGraphicsSceneWheelEvent::setInverted
              ((QGraphicsSceneWheelEvent *)in_stack_ffffffffffffff30,
               SUB41(in_stack_ffffffffffffff2c >> 0x18,0));
    QGraphicsSceneWheelEvent::setOrientation
              ((QGraphicsSceneWheelEvent *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    QEvent::setAccepted((QEvent *)&local_20,false);
    QInputEvent::timestamp((QInputEvent *)in_RSI);
    QGraphicsSceneEvent::setTimestamp
              (in_stack_ffffffffffffff30,
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    pQVar6 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3ed5c)->
              super_QObject;
    QCoreApplication::sendEvent(pQVar6,(QEvent *)&local_20);
    pQVar7 = in_RSI;
    bVar1 = QEvent::isAccepted((QEvent *)&local_20);
    (**(code **)(*(long *)pQVar7 + 0x10))(pQVar7,bVar1);
    bVar1 = QEvent::isAccepted(in_RSI);
    if (!bVar1) {
      QAbstractScrollArea::wheelEvent
                ((QAbstractScrollArea *)in_RDI,(QWheelEvent *)CONCAT44(RVar2.m_i,RVar4.m_i));
    }
    QGraphicsSceneWheelEvent::~QGraphicsSceneWheelEvent((QGraphicsSceneWheelEvent *)0xa3edc3);
  }
  else {
    QAbstractScrollArea::wheelEvent
              ((QAbstractScrollArea *)in_RDI,
               (QWheelEvent *)CONCAT44(in_stack_ffffffffffffff3c.i,in_stack_ffffffffffffff38));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::wheelEvent(QWheelEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene || !d->sceneInteractionAllowed) {
        QAbstractScrollArea::wheelEvent(event);
        return;
    }

    event->ignore();

    QGraphicsSceneWheelEvent wheelEvent(QEvent::GraphicsSceneWheel);
    wheelEvent.setWidget(viewport());
    wheelEvent.setScenePos(mapToScene(event->position().toPoint()));
    wheelEvent.setScreenPos(event->globalPosition().toPoint());
    wheelEvent.setButtons(event->buttons());
    wheelEvent.setModifiers(event->modifiers());
    const bool horizontal = qAbs(event->angleDelta().x()) > qAbs(event->angleDelta().y());
    wheelEvent.setDelta(horizontal ? event->angleDelta().x() : event->angleDelta().y());
    wheelEvent.setPixelDelta(event->pixelDelta());
    wheelEvent.setPhase(event->phase());
    wheelEvent.setInverted(event->isInverted());
    wheelEvent.setOrientation(horizontal ? Qt::Horizontal : Qt::Vertical);
    wheelEvent.setAccepted(false);
    wheelEvent.setTimestamp(event->timestamp());
    QCoreApplication::sendEvent(d->scene, &wheelEvent);
    event->setAccepted(wheelEvent.isAccepted());
    if (!event->isAccepted())
        QAbstractScrollArea::wheelEvent(event);
}